

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,bool value)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "false";
  if ((int)this != 0) {
    pcVar1 = "true";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString(bool value) { return value ? "true" : "false"; }